

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteGroupMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  CodedOutputStream *this;
  uint32 uVar1;
  LogMessage *other;
  LogFinisher local_a5 [20];
  byte local_91;
  LogMessage local_90;
  long local_58;
  uint8 *end;
  uint8 *target;
  CodedOutputStream *pCStack_40;
  int size;
  CodedOutputStream *output_local;
  MessageLite *value_local;
  CodedOutputStream *pCStack_28;
  int field_number_local;
  undefined4 local_20;
  int local_1c;
  CodedOutputStream *local_18;
  undefined4 local_10;
  int local_c;
  
  local_10 = 3;
  pCStack_40 = output;
  output_local = (CodedOutputStream *)value;
  value_local._4_4_ = field_number;
  local_18 = output;
  local_c = field_number;
  uVar1 = MakeTag(field_number,WIRETYPE_START_GROUP);
  io::CodedOutputStream::WriteTag(output,uVar1);
  target._4_4_ = (*(code *)output_local->output_[0xc]._vptr_ZeroCopyOutputStream)();
  end = io::CodedOutputStream::GetDirectBufferForNBytesAndAdvance(pCStack_40,target._4_4_);
  if (end == (uint8 *)0x0) {
    (*(code *)output_local->output_[10]._vptr_ZeroCopyOutputStream)(output_local,pCStack_40);
  }
  else {
    local_58 = (*(code *)output_local->output_[0xb]._vptr_ZeroCopyOutputStream)(output_local,end);
    local_91 = 0;
    if (local_58 - (long)end != (long)target._4_4_) {
      LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/wire_format_lite.cc"
                 ,0x142);
      local_91 = 1;
      other = LogMessage::operator<<(&local_90,"CHECK failed: (end - target) == (size): ");
      LogFinisher::operator=(local_a5,other);
    }
    if ((local_91 & 1) != 0) {
      LogMessage::~LogMessage(&local_90);
    }
  }
  this = pCStack_40;
  local_1c = value_local._4_4_;
  local_20 = 4;
  pCStack_28 = pCStack_40;
  uVar1 = MakeTag(value_local._4_4_,WIRETYPE_END_GROUP);
  io::CodedOutputStream::WriteTag(this,uVar1);
  return;
}

Assistant:

void WireFormatLite::WriteGroupMaybeToArray(int field_number,
                                            const MessageLite& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  const int size = value.GetCachedSize();
  uint8* target = output->GetDirectBufferForNBytesAndAdvance(size);
  if (target != NULL) {
    uint8* end = value.SerializeWithCachedSizesToArray(target);
    GOOGLE_DCHECK_EQ(end - target, size);
  } else {
    value.SerializeWithCachedSizes(output);
  }
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}